

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CDirectiveFill.cpp
# Opt level: O0

void __thiscall CDirectiveFill::Encode(CDirectiveFill *this)

{
  size_t __n;
  size_t local_c0;
  void *local_a0;
  size_t n;
  uchar ByteBuffer [128];
  CDirectiveFill *this_local;
  
  __n = (size_t)(uint)this->Byte;
  if (this->Size < 0x81) {
    local_c0 = this->Size;
  }
  else {
    local_c0 = 0x80;
  }
  memset(&n,this->Byte & 0xff,local_c0);
  for (local_a0 = (void *)this->Size; (void *)0x80 < local_a0;
      local_a0 = (void *)((long)local_a0 + -0x80)) {
    FileManager::write(g_fileManager,(int)&n,(void *)0x80,__n);
  }
  FileManager::write(g_fileManager,(int)&n,local_a0,__n);
  return;
}

Assistant:

void CDirectiveFill::Encode()
{
	unsigned char ByteBuffer[128];

	memset(ByteBuffer,Byte,Size > 128 ? 128 : Size);
	size_t n = Size;
	while (n > 128)
	{
		g_fileManager->write(ByteBuffer,128);
		n -= 128;
	}
	g_fileManager->write(ByteBuffer,n);
}